

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O1

int main(void)

{
  A *pAVar1;
  pointer pcVar2;
  pointer puVar3;
  pointer puVar4;
  pointer pbVar5;
  pointer pfVar6;
  int i;
  ostream *poVar7;
  long lVar8;
  out_of_range *this;
  code *pcVar9;
  unique_ptr<A,_std::default_delete<A>_> *ap;
  pointer puVar10;
  pointer ppAVar11;
  pointer __x;
  undefined *puVar12;
  pointer pbVar13;
  unique_ptr<A,_std::default_delete<A>_> *ap_1;
  initializer_list<A_*> __l;
  string greet;
  string john;
  Adder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> baz;
  string s;
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  vua;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sv;
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  fv;
  vector<A_*,_std::allocator<A_*>_> vpa;
  undefined1 local_1f0 [16];
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  char local_1ca;
  char local_1c9;
  _Any_data local_1c8;
  _Manager_type local_1b8;
  code *pcStack_1b0;
  Adder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1a8;
  char *local_188;
  ulong local_180;
  char local_178;
  undefined7 uStack_177;
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  local_168;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  _Head_base<0UL,_A_*,_false> local_128;
  undefined1 local_120 [12];
  undefined8 local_114;
  undefined4 local_10c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  local_e8;
  vector<A_*,_std::allocator<A_*>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80 [2];
  shared_ptr<A> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_188 = &local_178;
  local_180 = 0;
  local_178 = '\0';
  std::operator>>((istream *)&std::cin,(string *)&local_188);
  if (local_180 < 0xb) {
    if (4 < local_180) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_188,local_180);
      local_1c9 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_1c9,1);
      local_114 = 0x3e4ccccd3dcccccd;
      local_10c = 0x3e99999a;
      local_120._0_4_ = 0.1;
      local_120._4_4_ = 0.2;
      local_120._8_4_ = 0.3;
      local_40 = 0x3e4ccccd3dcccccd;
      uStack_38 = 0x3f0000003e99999a;
      local_1a8.y._M_string_length._0_4_ = 0;
      local_1a8.y._M_dataplus._M_p = (pointer)0x0;
      lVar8 = 0;
      do {
        *(float *)((long)&local_1a8.y._M_dataplus._M_p + lVar8 * 4) =
             *(float *)((long)&local_114 + lVar8 * 4) * *(float *)(local_120 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      local_1f0._8_8_ = local_1f0._8_8_ & 0xffffffff00000000;
      local_1f0._0_8_ = (__uniq_ptr_impl<A,_std::default_delete<A>_>)0x0;
      lVar8 = 0;
      do {
        *(float *)(local_1f0 + lVar8 * 4) =
             *(float *)((long)&local_1a8.y._M_dataplus._M_p + lVar8 * 4) +
             *(float *)((long)&local_114 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      poVar7 = operator<<((ostream *)&std::cout,(Vec<float,_3UL> *)local_1f0);
      local_1c8._M_pod_data[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1c8._M_pod_data,1);
      Vec<float,3ul>::operator+((Vec<float,3ul> *)local_1f0,(Vec<float,_4UL> *)local_120);
      poVar7 = operator<<((ostream *)&std::cout,(Vec<float,_4UL> *)local_1f0);
      local_1ca = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_1ca,1);
      local_168.
      super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.
      super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.
      super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1f0._0_8_ = operator_new(0x10);
      *(undefined ***)local_1f0._0_8_ = &PTR_foo_00107c28;
      *(undefined4 *)(local_1f0._0_8_ + 8) = 3;
      local_1a8.y._M_dataplus._M_p = (pointer)0x0;
      std::
      vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
      ::emplace_back<std::unique_ptr<A,std::default_delete<A>>>
                ((vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
                  *)&local_168,(unique_ptr<A,_std::default_delete<A>_> *)local_1f0);
      std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr
                ((unique_ptr<A,_std::default_delete<A>_> *)local_1f0);
      std::unique_ptr<B,_std::default_delete<B>_>::~unique_ptr
                ((unique_ptr<B,_std::default_delete<B>_> *)&local_1a8);
      local_1f0._0_8_ = operator_new(0x10);
      *(undefined ***)local_1f0._0_8_ = &PTR_foo_00107c28;
      *(undefined4 *)(local_1f0._0_8_ + 8) = 4;
      local_1a8.y._M_dataplus._M_p = (pointer)0x0;
      std::
      vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
      ::emplace_back<std::unique_ptr<A,std::default_delete<A>>>
                ((vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
                  *)&local_168,(unique_ptr<A,_std::default_delete<A>_> *)local_1f0);
      std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr
                ((unique_ptr<A,_std::default_delete<A>_> *)local_1f0);
      std::unique_ptr<B,_std::default_delete<B>_>::~unique_ptr
                ((unique_ptr<B,_std::default_delete<B>_> *)&local_1a8);
      local_1f0._0_8_ = operator_new(0x10);
      *(undefined ***)local_1f0._0_8_ = &PTR_foo_00107c80;
      local_1a8.y._M_dataplus._M_p = (pointer)0x0;
      std::
      vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
      ::emplace_back<std::unique_ptr<A,std::default_delete<A>>>
                ((vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
                  *)&local_168,(unique_ptr<A,_std::default_delete<A>_> *)local_1f0);
      std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr
                ((unique_ptr<A,_std::default_delete<A>_> *)local_1f0);
      std::unique_ptr<C,_std::default_delete<C>_>::~unique_ptr
                ((unique_ptr<C,_std::default_delete<C>_> *)&local_1a8);
      local_1f0._0_8_ = operator_new(0x10);
      *(undefined ***)local_1f0._0_8_ = &PTR_foo_00107c80;
      local_1a8.y._M_dataplus._M_p = (pointer)0x0;
      std::
      vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
      ::emplace_back<std::unique_ptr<A,std::default_delete<A>>>
                ((vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
                  *)&local_168,(unique_ptr<A,_std::default_delete<A>_> *)local_1f0);
      std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr
                ((unique_ptr<A,_std::default_delete<A>_> *)local_1f0);
      std::unique_ptr<C,_std::default_delete<C>_>::~unique_ptr
                ((unique_ptr<C,_std::default_delete<C>_> *)&local_1a8);
      local_1f0._0_8_ = operator_new(0x10);
      *(undefined ***)local_1f0._0_8_ = &PTR_foo_00107c28;
      *(undefined4 *)(local_1f0._0_8_ + 8) = 1;
      local_1f0._8_8_ = operator_new(0x10);
      *(undefined ***)local_1f0._8_8_ = &PTR_foo_00107c28;
      *(undefined4 *)(local_1f0._8_8_ + 8) = 2;
      local_1e0 = (undefined8 *)operator_new(0x10);
      *local_1e0 = &PTR_foo_00107c80;
      local_1d8 = (undefined8 *)operator_new(0x10);
      *local_1d8 = &PTR_foo_00107c80;
      __l._M_len = 4;
      __l._M_array = (iterator)local_1f0;
      std::vector<A_*,_std::allocator<A_*>_>::vector(&local_c8,__l,(allocator_type *)&local_1a8);
      puVar3 = local_168.
               super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar10 = local_168.
                     super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppAVar11 = local_c8.super__Vector_base<A_*,_std::allocator<A_*>_>._M_impl.
                     super__Vector_impl_data._M_start, puVar10 != puVar3; puVar10 = puVar10 + 1) {
        (**((puVar10->_M_t).super___uniq_ptr_impl<A,_std::default_delete<A>_>._M_t.
            super__Tuple_impl<0UL,_A_*,_std::default_delete<A>_>.super__Head_base<0UL,_A_*,_false>.
           _M_head_impl)->_vptr_A)();
      }
      for (; ppAVar11 !=
             local_c8.super__Vector_base<A_*,_std::allocator<A_*>_>._M_impl.super__Vector_impl_data.
             _M_finish; ppAVar11 = ppAVar11 + 1) {
        (**(*ppAVar11)->_vptr_A)();
      }
      local_128._M_head_impl =
           local_168.
           super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
           super___uniq_ptr_impl<A,_std::default_delete<A>_>._M_t.
           super__Tuple_impl<0UL,_A_*,_std::default_delete<A>_>.super__Head_base<0UL,_A_*,_false>.
           _M_head_impl;
      local_168.
      super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
      super___uniq_ptr_impl<A,_std::default_delete<A>_>._M_t.
      super__Tuple_impl<0UL,_A_*,_std::default_delete<A>_>.super__Head_base<0UL,_A_*,_false>.
      _M_head_impl = (A *)0x0;
      takes_ownership((unique_ptr<A,_std::default_delete<A>_> *)&local_128);
      std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr
                ((unique_ptr<A,_std::default_delete<A>_> *)&local_128);
      local_70.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_168.
           super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
           super___uniq_ptr_impl<A,_std::default_delete<A>_>._M_t.
           super__Tuple_impl<0UL,_A_*,_std::default_delete<A>_>.super__Head_base<0UL,_A_*,_false>.
           _M_head_impl;
      local_168.
      super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
      super___uniq_ptr_impl<A,_std::default_delete<A>_>._M_t.
      super__Tuple_impl<0UL,_A_*,_std::default_delete<A>_>.super__Head_base<0UL,_A_*,_false>.
      _M_head_impl = (A *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<A*>
                (&local_70.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 local_70.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      shared_ownership(&local_70);
      puVar3 = local_168.
               super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar10 = local_168.
                super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_70.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        puVar3 = local_168.
                 super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar10 = local_168.
                  super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; puVar4 = local_168.
                      super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
          puVar3 != local_168.
                    super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
        pAVar1 = (puVar3->_M_t).super___uniq_ptr_impl<A,_std::default_delete<A>_>._M_t.
                 super__Tuple_impl<0UL,_A_*,_std::default_delete<A>_>.
                 super__Head_base<0UL,_A_*,_false>._M_head_impl;
        if (pAVar1 == (A *)0x0) {
          local_168.
          super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"The ownership has moved away!\n",0x1e);
        }
        else {
          local_168.
          super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar10;
          (**pAVar1->_vptr_A)();
        }
        puVar10 = local_168.
                  super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_168.
        super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar4;
      }
      local_1f0._0_8_ = &local_1e0;
      local_168.
      super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"Hello, ","");
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Bye, ","");
      local_1a8.y._M_dataplus._M_p = (pointer)&local_1a8.y.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,local_90,local_88 + (long)local_90);
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      local_e8.
      super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)0x0;
      local_e8.
      super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)0x0;
      local_e8.
      super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1c8._8_8_ = 0;
      pcStack_1b0 = std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/split-tutor[P]potpourri/potpourri.cpp:221:16)>
                    ::_M_invoke;
      local_1b8 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/split-tutor[P]potpourri/potpourri.cpp:221:16)>
                  ::_M_manager;
      local_1c8._M_unused._M_object = (string *)local_1f0;
      std::
      vector<std::function<std::__cxx11::string(std::__cxx11::string)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string)>>>
      ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string)>>
                ((vector<std::function<std::__cxx11::string(std::__cxx11::string)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string)>>>
                  *)&local_e8,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)&local_1c8);
      if (local_1b8 != (_Manager_type)0x0) {
        (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
      }
      local_1c8._8_8_ = 0;
      local_1c8._M_unused._M_member_pointer = 0x2a;
      pcStack_1b0 = std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/split-tutor[P]potpourri/potpourri.cpp:224:16)>
                    ::_M_invoke;
      local_1b8 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/split-tutor[P]potpourri/potpourri.cpp:224:16)>
                  ::_M_manager;
      std::
      vector<std::function<std::__cxx11::string(std::__cxx11::string)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string)>>>
      ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string)>>
                ((vector<std::function<std::__cxx11::string(std::__cxx11::string)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string)>>>
                  *)&local_e8,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)&local_1c8);
      if (local_1b8 != (_Manager_type)0x0) {
        (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
      }
      std::function<std::__cxx11::string(std::__cxx11::string)>::
      function<Adder<std::__cxx11::string>&,void>
                ((function<std::__cxx11::string(std::__cxx11::string)> *)local_1c8._M_pod_data,
                 &local_1a8);
      std::
      vector<std::function<std::__cxx11::string(std::__cxx11::string)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string)>>>
      ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string)>>
                ((vector<std::function<std::__cxx11::string(std::__cxx11::string)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string)>>>
                  *)&local_e8,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)&local_1c8);
      if (local_1b8 != (_Manager_type)0x0) {
        (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
      }
      local_1c8._M_unused._M_object = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"John Doe","");
      pfVar6 = local_e8.
               super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_e8.
          super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_e8.
          super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __x = local_e8.
              super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)&local_148,__x);
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,local_1c8._M_unused._M_object,
                     local_1c8._8_8_ + (long)local_1c8._M_unused._0_8_);
          if (local_138 == (code *)0x0) {
            std::__throw_bad_function_call();
            goto LAB_00102f45;
          }
          (*local_130)(&local_b0,&local_148,&local_60);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108
                     ,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_b0._M_dataplus._M_p._1_7_,local_b0._M_dataplus._M_p._0_1_) !=
              &local_b0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_b0._M_dataplus._M_p._1_7_,local_b0._M_dataplus._M_p._0_1_
                                    ),local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a\n",2);
          if (local_138 != (code *)0x0) {
            (*local_138)(&local_148,&local_148,__destroy_functor);
          }
          __x = __x + 1;
        } while (__x != pfVar6);
      }
      pbVar5 = local_108.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_108.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_108.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar13 = local_108.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar2 = (pbVar13->_M_dataplus)._M_p;
          local_148._M_unused._M_object = &local_138;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,pcVar2,pcVar2 + pbVar13->_M_string_length);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_148._M_unused._0_8_,
                              local_148._8_8_);
          local_b0._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_b0,1);
          if ((code **)local_148._M_unused._0_8_ != &local_138) {
            operator_delete(local_148._M_unused._M_object,(ulong)(local_138 + 1));
          }
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 != pbVar5);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_108);
      if ((_Manager_type *)local_1c8._M_unused._0_8_ != &local_1b8) {
        operator_delete(local_1c8._M_unused._M_object,(ulong)(local_1b8 + 1));
      }
      std::
      vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
      ::~vector(&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8.y._M_dataplus._M_p != &local_1a8.y.field_2) {
        operator_delete(local_1a8.y._M_dataplus._M_p,local_1a8.y.field_2._M_allocated_capacity + 1);
      }
      if ((A *)local_1f0._0_8_ != (A *)&local_1e0) {
        operator_delete((void *)local_1f0._0_8_,(long)local_1e0 + 1);
      }
      if (local_c8.super__Vector_base<A_*,_std::allocator<A_*>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<A_*,_std::allocator<A_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.super__Vector_base<A_*,_std::allocator<A_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.super__Vector_base<A_*,_std::allocator<A_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ::~vector(&local_168);
      if (local_188 != &local_178) {
        operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
      }
      return 0;
    }
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument((invalid_argument *)this,"invalid argument");
    pcVar9 = std::invalid_argument::~invalid_argument;
    puVar12 = &std::invalid_argument::typeinfo;
  }
  else {
LAB_00102f45:
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Out of range");
    pcVar9 = std::out_of_range::~out_of_range;
    puVar12 = &std::out_of_range::typeinfo;
  }
  __cxa_throw(this,puVar12,pcVar9);
}

Assistant:

int main()
{
    /**
     * 1. try-block for exception handling
     */
    std::string s;
    std::cin >> s;

    try {
        if (s.length() > 10) {
            throw std::out_of_range("Out of range");
        } else if (s.length() < 5) {
            throw std::invalid_argument("invalid argument");
        } else {
            std::cout << s << '\n';
        }
    } catch (const std::out_of_range& e) {
        std::cout << e.what() << '\n';
    } catch (const std::invalid_argument& e) {
        std::cout << e.what() << '\n';
    }

    /**
     * 2. Constant template
     */
    Vec<float, 3> f{0.1, 0.2, 0.3};
    Vec<float, 3> g{0.1, 0.2, 0.3};
    Vec<float, 4> h{0.1, 0.2, 0.3, 0.5};

    std::cout << (f * g) + f << '\n';

    try {
        // Vector size mismatch
        auto m = g + h;
        
        // Never reached
        std::cout << m << '\n';
    } catch (const std::exception& e) {
        std::cout << e.what() << '\n';
    }

    // unique_ptr for strict ownership management
    std::vector<std::unique_ptr<A>> vua;
    vua.push_back(std::make_unique<B>(3));
    vua.push_back(std::make_unique<B>(4));
    vua.push_back(std::make_unique<C>(5));
    vua.push_back(std::make_unique<C>(6));

    std::vector<A*> vpa = {
        new B(1),
        new B(2),
        new C(7),
        new C(8)
    };

    for (auto&& ap : vua) {
        ap->foo();
    }

    for (auto ap : vpa) {
        ap->foo();
    }

    // The ownership is passed to the function. Note `std::move()` used here
    takes_ownership(std::move(vua[1]));
    // `unique_ptr` can also be shared over multiple functions.
    // Note that `.release()` is called to release a shared_ptr from the `unique_ptr`.
    shared_ownership(std::shared_ptr<A>(vua[2].release()));

    for (auto&& ap : vua) {
        if (!ap) {
            std::cout << "The ownership has moved away!\n";
        } else {
            ap->foo();
        }
    }
    
    /**
     * 4. Lambda
     */
    std::string greet = "Hello, ";
    int secret = 42;

    // Captures the _reference_  of `greet`
    auto foo = [&greet](std::string name){ return greet + name; };

    // Capatures the _value_ of `secret`
    auto bar = [secret](std::string name){
        std::ostringstream oss;

        oss << name << "got the secret (" << secret << ')';

        return oss.str();
    };

    auto baz = Adder<std::string>{"Bye, "};

    std::vector<std::function<std::string(std::string)>> fv;
    fv.push_back(foo);
    fv.push_back(bar);

    // A function class is also considered as a function type
    fv.push_back(baz);

    std::string john = "John Doe";
    std::vector<std::string> sv;
    for (auto f : fv) {
        sv.push_back(f(john));
        std::cout << "a\n";
    }

    for (auto s : sv) {
        std::cout << s << '\n';
    }
}